

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

bool anon_unknown.dwarf_7a8b67::SubConditionHelper
               (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                *out,Value *value,cmJSONState *state)

{
  Condition *pCVar1;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  pointer __p;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ptr;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_30;
  
  local_30._M_head_impl = (Condition *)0x0;
  bVar3 = ConditionHelper((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           *)&local_30,value,state);
  _Var2._M_head_impl = local_30._M_head_impl;
  if (local_30._M_head_impl != (Condition *)0x0) {
    iVar4 = (*(local_30._M_head_impl)->_vptr_Condition[3])(local_30._M_head_impl);
    if ((char)iVar4 != '\0') {
      cmCMakePresetsErrors::INVALID_CONDITION(value,state);
      bVar3 = false;
      goto LAB_00276066;
    }
  }
  local_30._M_head_impl = (Condition *)0x0;
  pCVar1 = (out->_M_t).
           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
  (out->_M_t).
  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (pCVar1 != (Condition *)0x0) {
    (*pCVar1->_vptr_Condition[1])();
  }
LAB_00276066:
  if (local_30._M_head_impl != (Condition *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Condition[1])();
  }
  return bVar3;
}

Assistant:

bool SubConditionHelper(std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
                        const Json::Value* value, cmJSONState* state)
{
  std::unique_ptr<cmCMakePresetsGraph::Condition> ptr;
  auto result = ConditionHelper(ptr, value, state);
  if (ptr && ptr->IsNull()) {
    cmCMakePresetsErrors::INVALID_CONDITION(value, state);
    return false;
  }
  out = std::move(ptr);
  return result;
}